

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthCofactor0Count(uint *pTruth,int nVars,int iVar)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar9 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x1a8,"int Kit_TruthCofactor0Count(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    uVar10 = 0;
    uVar8 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar8 = uVar10;
    }
    iVar6 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes(pTruth[uVar10] & 0x55555555);
      iVar6 = iVar6 + iVar3;
    }
    break;
  case 1:
    uVar10 = 0;
    uVar8 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar8 = uVar10;
    }
    iVar6 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes(pTruth[uVar10] & 0x33333333);
      iVar6 = iVar6 + iVar3;
    }
    break;
  case 2:
    uVar10 = 0;
    uVar8 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar8 = uVar10;
    }
    iVar6 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes(pTruth[uVar10] & 0xf0f0f0f);
      iVar6 = iVar6 + iVar3;
    }
    break;
  case 3:
    uVar10 = 0;
    uVar8 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar8 = uVar10;
    }
    iVar6 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes(pTruth[uVar10] & 0xff00ff);
      iVar6 = iVar6 + iVar3;
    }
    break;
  case 4:
    uVar10 = 0;
    uVar8 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar8 = uVar10;
    }
    iVar6 = 0;
    for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes((uint)(ushort)pTruth[uVar10]);
      iVar6 = iVar6 + iVar3;
    }
    break;
  default:
    bVar5 = (char)iVar - 5;
    bVar1 = bVar5 & 0x1f;
    iVar3 = 2 << (bVar5 & 0x1f);
    iVar7 = 0;
    uVar2 = 1 << bVar1;
    if (1 << bVar1 < 1) {
      uVar2 = 0;
    }
    iVar6 = 0;
    for (; iVar7 < (int)uVar9; iVar7 = iVar7 + iVar3) {
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        iVar4 = Kit_WordCountOnes(pTruth[uVar8]);
        iVar6 = iVar6 + iVar4;
      }
      pTruth = pTruth + iVar3;
    }
  }
  return iVar6;
}

Assistant:

int Kit_TruthCofactor0Count( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step, Counter = 0;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes(pTruth[i] & 0x55555555);
        return Counter;
    case 1:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes(pTruth[i] & 0x33333333);
        return Counter;
    case 2:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes(pTruth[i] & 0x0F0F0F0F);
        return Counter;
    case 3:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes(pTruth[i] & 0x00FF00FF);
        return Counter;
    case 4:
        for ( i = 0; i < nWords; i++ )
            Counter += Kit_WordCountOnes(pTruth[i] & 0x0000FFFF);
        return Counter;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                Counter += Kit_WordCountOnes(pTruth[i]);
            pTruth += 2*Step;
        }
        return Counter;
    }
}